

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersector1<4,_16777232,_true,_embree::avx2::SubGridMBIntersector1Pluecker<4,_true>_>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  uint uVar24;
  int iVar25;
  AABBNodeMB4D *node1;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  Geometry *pGVar29;
  Scene *pSVar30;
  Ray *pRVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  RTCIntersectArguments *pRVar40;
  undefined4 uVar41;
  ulong unaff_R12;
  size_t mask;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  bool bVar46;
  float fVar47;
  float fVar55;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  vint4 ai;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar69;
  float fVar80;
  float fVar81;
  vint4 bi;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar82;
  undefined1 auVar79 [32];
  vint4 ai_1;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  vint4 bi_1;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  vint4 bi_7;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  float fVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar141;
  undefined1 auVar134 [32];
  float fVar138;
  float fVar140;
  float fVar142;
  float fVar144;
  float fVar146;
  float fVar148;
  undefined1 auVar135 [32];
  float fVar137;
  float fVar139;
  float fVar143;
  float fVar145;
  float fVar147;
  undefined1 auVar136 [64];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  float fVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar157 [64];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  float fVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar170 [64];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  UVIdentity<8> mapUV;
  Scene *scene;
  vint4 bi_5;
  vint4 bi_2;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  PlueckerHitM<8,_embree::avx2::UVIdentity<8>_> hit;
  NodeRef stack [244];
  undefined1 local_d79;
  ulong *local_d78;
  ulong local_d70;
  ulong local_d68;
  ulong local_d60;
  ulong local_d58;
  ulong local_d50;
  RayQueryContext *local_d48;
  Scene *local_d40;
  uint local_d34;
  uint local_d30;
  int local_d2c;
  ulong local_d28;
  undefined8 local_d20;
  undefined1 auStack_d18 [8];
  float fStack_d10;
  float fStack_d0c;
  float fStack_d08;
  float fStack_d04;
  undefined1 local_d00 [32];
  ulong local_ce0;
  undefined1 auStack_cd8 [24];
  RTCRayQueryContext *local_cc0;
  undefined1 auStack_cb8 [24];
  undefined1 local_ca0 [32];
  undefined1 local_c80 [16];
  undefined1 local_c70 [16];
  undefined1 local_c60 [16];
  undefined1 local_c50 [16];
  float local_c40;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  float local_c10;
  float fStack_c0c;
  float fStack_c08;
  float fStack_c04;
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  undefined1 local_be0 [16];
  ulong local_bc8;
  long local_bc0;
  ulong local_bb8;
  ulong local_bb0;
  Ray *local_ba8;
  ulong local_ba0;
  ulong local_b98;
  long local_b90;
  long local_b88;
  RTCIntersectArguments *local_b80;
  undefined1 auStack_b78 [24];
  Geometry *local_b60;
  undefined1 auStack_b58 [24];
  undefined4 local_b40;
  float local_b3c;
  float local_b38;
  undefined4 local_b34;
  undefined4 local_b30;
  undefined4 local_b2c;
  undefined4 local_b28;
  uint local_b24;
  uint local_b20;
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  undefined1 local_a40 [32];
  undefined4 local_a20;
  undefined4 uStack_a1c;
  undefined4 uStack_a18;
  undefined4 uStack_a14;
  undefined4 uStack_a10;
  undefined4 uStack_a0c;
  undefined4 uStack_a08;
  undefined4 uStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 *local_900;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  float local_820 [4];
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined4 uStack_804;
  ulong local_800 [250];
  
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar58 = ray->tfar, 0.0 <= fVar58)) {
    local_d78 = local_800 + 1;
    local_800[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    aVar1 = (ray->dir).field_0;
    auVar59 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
    auVar49._8_4_ = 0x7fffffff;
    auVar49._0_8_ = 0x7fffffff7fffffff;
    auVar49._12_4_ = 0x7fffffff;
    auVar49 = vandps_avx((undefined1  [16])aVar1,auVar49);
    auVar95._8_4_ = 0x219392ef;
    auVar95._0_8_ = 0x219392ef219392ef;
    auVar95._12_4_ = 0x219392ef;
    auVar49 = vcmpps_avx(auVar49,auVar95,1);
    auVar96._8_4_ = 0x3f800000;
    auVar96._0_8_ = &DAT_3f8000003f800000;
    auVar96._12_4_ = 0x3f800000;
    auVar95 = vdivps_avx(auVar96,(undefined1  [16])aVar1);
    auVar97._8_4_ = 0x5d5e0b6b;
    auVar97._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar97._12_4_ = 0x5d5e0b6b;
    auVar49 = vblendvps_avx(auVar95,auVar97,auVar49);
    auVar83._0_4_ = auVar49._0_4_ * 0.99999964;
    auVar83._4_4_ = auVar49._4_4_ * 0.99999964;
    auVar83._8_4_ = auVar49._8_4_ * 0.99999964;
    auVar83._12_4_ = auVar49._12_4_ * 0.99999964;
    auVar70._0_4_ = auVar49._0_4_ * 1.0000004;
    auVar70._4_4_ = auVar49._4_4_ * 1.0000004;
    auVar70._8_4_ = auVar49._8_4_ * 1.0000004;
    auVar70._12_4_ = auVar49._12_4_ * 1.0000004;
    uVar41 = *(undefined4 *)&(ray->org).field_0;
    local_be0._4_4_ = uVar41;
    local_be0._0_4_ = uVar41;
    local_be0._8_4_ = uVar41;
    local_be0._12_4_ = uVar41;
    auVar136 = ZEXT1664(local_be0);
    uVar41 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
    local_bf0._4_4_ = uVar41;
    local_bf0._0_4_ = uVar41;
    local_bf0._8_4_ = uVar41;
    local_bf0._12_4_ = uVar41;
    auVar153 = ZEXT1664(local_bf0);
    uVar41 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
    local_c00._4_4_ = uVar41;
    local_c00._0_4_ = uVar41;
    local_c00._8_4_ = uVar41;
    local_c00._12_4_ = uVar41;
    auVar157 = ZEXT1664(local_c00);
    auVar49 = vmovshdup_avx(auVar83);
    local_c20 = vshufps_avx(auVar83,auVar83,0x55);
    auVar170 = ZEXT1664(local_c20);
    auVar95 = vshufpd_avx(auVar83,auVar83,1);
    local_c30 = vshufps_avx(auVar83,auVar83,0xaa);
    auVar179 = ZEXT1664(local_c30);
    local_c50 = vshufps_avx(auVar70,auVar70,0x55);
    auVar184 = ZEXT1664(local_c50);
    uVar42 = (ulong)(auVar83._0_4_ < 0.0) << 4;
    uVar33 = (ulong)(auVar49._0_4_ < 0.0) << 4 | 0x20;
    local_c60 = vshufps_avx(auVar70,auVar70,0xaa);
    auVar124 = ZEXT1664(local_c60);
    uVar34 = (ulong)(auVar95._0_4_ < 0.0) << 4 | 0x40;
    uVar35 = uVar42 ^ 0x10;
    uVar37 = uVar33 ^ 0x10;
    uVar38 = uVar34 ^ 0x10;
    uVar41 = auVar59._0_4_;
    local_c70._4_4_ = uVar41;
    local_c70._0_4_ = uVar41;
    local_c70._8_4_ = uVar41;
    local_c70._12_4_ = uVar41;
    auVar114 = ZEXT1664(local_c70);
    local_aa0._16_16_ = mm_lookupmask_ps._240_16_;
    local_aa0._0_16_ = mm_lookupmask_ps._240_16_;
    local_a40 = vperm2f128_avx(local_aa0,mm_lookupmask_ps._0_32_,2);
    local_c80._4_4_ = fVar58;
    local_c80._0_4_ = fVar58;
    local_c80._8_4_ = fVar58;
    local_c80._12_4_ = fVar58;
    auVar130 = ZEXT1664(local_c80);
    auVar74._8_4_ = 0x3f800000;
    auVar74._0_8_ = &DAT_3f8000003f800000;
    auVar74._12_4_ = 0x3f800000;
    auVar74._16_4_ = 0x3f800000;
    auVar74._20_4_ = 0x3f800000;
    auVar74._24_4_ = 0x3f800000;
    auVar74._28_4_ = 0x3f800000;
    auVar106._8_4_ = 0xbf800000;
    auVar106._0_8_ = 0xbf800000bf800000;
    auVar106._12_4_ = 0xbf800000;
    auVar106._16_4_ = 0xbf800000;
    auVar106._20_4_ = 0xbf800000;
    auVar106._24_4_ = 0xbf800000;
    auVar106._28_4_ = 0xbf800000;
    _local_a60 = vblendvps_avx(auVar74,auVar106,local_a40);
    local_ba8 = ray;
    local_bb0 = uVar42;
    local_c10 = auVar83._0_4_;
    fStack_c0c = auVar83._0_4_;
    fStack_c08 = auVar83._0_4_;
    fStack_c04 = auVar83._0_4_;
    local_c40 = auVar70._0_4_;
    fStack_c3c = auVar70._0_4_;
    fStack_c38 = auVar70._0_4_;
    fStack_c34 = auVar70._0_4_;
    fVar58 = auVar83._0_4_;
    fVar68 = auVar83._0_4_;
    fVar47 = auVar83._0_4_;
    fVar55 = auVar70._0_4_;
    fVar56 = auVar70._0_4_;
    fVar57 = auVar70._0_4_;
    local_d70 = uVar38;
    local_d68 = uVar37;
    local_d60 = uVar35;
    local_d58 = uVar34;
    local_d50 = uVar33;
    local_d48 = context;
    do {
      if (local_d78 == local_800) {
        return;
      }
      uVar44 = local_d78[-1];
      local_d78 = local_d78 + -1;
      do {
        if ((uVar44 & 8) == 0) {
          uVar26 = uVar44 & 0xfffffffffffffff0;
          uVar41 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
          auVar48._4_4_ = uVar41;
          auVar48._0_4_ = uVar41;
          auVar48._8_4_ = uVar41;
          auVar48._12_4_ = uVar41;
          auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + uVar42),auVar48,
                                    *(undefined1 (*) [16])(uVar26 + 0x20 + uVar42));
          auVar49 = vsubps_avx(auVar49,auVar136._0_16_);
          auVar95 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + uVar33),auVar48,
                                    *(undefined1 (*) [16])(uVar26 + 0x20 + uVar33));
          auVar59._0_4_ = auVar83._0_4_ * auVar49._0_4_;
          auVar59._4_4_ = fVar58 * auVar49._4_4_;
          auVar59._8_4_ = fVar68 * auVar49._8_4_;
          auVar59._12_4_ = fVar47 * auVar49._12_4_;
          auVar49 = vsubps_avx(auVar95,auVar153._0_16_);
          auVar71._0_4_ = auVar170._0_4_ * auVar49._0_4_;
          auVar71._4_4_ = auVar170._4_4_ * auVar49._4_4_;
          auVar71._8_4_ = auVar170._8_4_ * auVar49._8_4_;
          auVar71._12_4_ = auVar170._12_4_ * auVar49._12_4_;
          auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + uVar34),auVar48,
                                    *(undefined1 (*) [16])(uVar26 + 0x20 + uVar34));
          auVar49 = vsubps_avx(auVar49,auVar157._0_16_);
          auVar84._0_4_ = auVar179._0_4_ * auVar49._0_4_;
          auVar84._4_4_ = auVar179._4_4_ * auVar49._4_4_;
          auVar84._8_4_ = auVar179._8_4_ * auVar49._8_4_;
          auVar84._12_4_ = auVar179._12_4_ * auVar49._12_4_;
          auVar49 = vmaxps_avx(auVar71,auVar84);
          auVar95 = vmaxps_avx(auVar114._0_16_,auVar59);
          auVar49 = vmaxps_avx(auVar95,auVar49);
          auVar95 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + uVar35),auVar48,
                                    *(undefined1 (*) [16])(uVar26 + 0x20 + uVar35));
          auVar95 = vsubps_avx(auVar95,auVar136._0_16_);
          auVar72._0_4_ = auVar70._0_4_ * auVar95._0_4_;
          auVar72._4_4_ = fVar55 * auVar95._4_4_;
          auVar72._8_4_ = fVar56 * auVar95._8_4_;
          auVar72._12_4_ = fVar57 * auVar95._12_4_;
          auVar95 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + uVar37),auVar48,
                                    *(undefined1 (*) [16])(uVar26 + 0x20 + uVar37));
          auVar95 = vsubps_avx(auVar95,auVar153._0_16_);
          auVar85._0_4_ = auVar184._0_4_ * auVar95._0_4_;
          auVar85._4_4_ = auVar184._4_4_ * auVar95._4_4_;
          auVar85._8_4_ = auVar184._8_4_ * auVar95._8_4_;
          auVar85._12_4_ = auVar184._12_4_ * auVar95._12_4_;
          auVar95 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + uVar38),auVar48,
                                    *(undefined1 (*) [16])(uVar26 + 0x20 + uVar38));
          auVar95 = vsubps_avx(auVar95,auVar157._0_16_);
          auVar98._0_4_ = auVar124._0_4_ * auVar95._0_4_;
          auVar98._4_4_ = auVar124._4_4_ * auVar95._4_4_;
          auVar98._8_4_ = auVar124._8_4_ * auVar95._8_4_;
          auVar98._12_4_ = auVar124._12_4_ * auVar95._12_4_;
          auVar95 = vminps_avx(auVar85,auVar98);
          auVar59 = vminps_avx(auVar130._0_16_,auVar72);
          auVar95 = vminps_avx(auVar59,auVar95);
          if (((uint)uVar44 & 7) == 6) {
            auVar95 = vcmpps_avx(auVar49,auVar95,2);
            auVar49 = vcmpps_avx(*(undefined1 (*) [16])(uVar26 + 0xe0),auVar48,2);
            auVar59 = vcmpps_avx(auVar48,*(undefined1 (*) [16])(uVar26 + 0xf0),1);
            auVar49 = vandps_avx(auVar49,auVar59);
            auVar49 = vandps_avx(auVar49,auVar95);
          }
          else {
            auVar49 = vcmpps_avx(auVar49,auVar95,2);
          }
          auVar49 = vpslld_avx(auVar49,0x1f);
          uVar41 = vmovmskps_avx(auVar49);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar41);
        }
        if ((uVar44 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar25 = 4;
          }
          else {
            uVar26 = uVar44 & 0xfffffffffffffff0;
            lVar39 = 0;
            for (uVar44 = unaff_R12; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
              lVar39 = lVar39 + 1;
            }
            iVar25 = 0;
            for (uVar28 = unaff_R12 - 1 & unaff_R12; uVar44 = *(ulong *)(uVar26 + lVar39 * 8),
                uVar28 != 0; uVar28 = uVar28 - 1 & uVar28) {
              *local_d78 = uVar44;
              local_d78 = local_d78 + 1;
              lVar39 = 0;
              for (uVar44 = uVar28; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
                lVar39 = lVar39 + 1;
              }
            }
          }
        }
        else {
          iVar25 = 6;
        }
      } while (iVar25 == 0);
      if (iVar25 == 6) {
        local_bb8 = (ulong)((uint)uVar44 & 0xf) - 8;
        bVar46 = local_bb8 != 0;
        if (bVar46) {
          uVar44 = uVar44 & 0xfffffffffffffff0;
          local_b98 = 0;
          do {
            lVar39 = local_b98 * 0x90;
            uVar26 = *(ulong *)(uVar44 + 0x20 + lVar39);
            auVar50._8_8_ = 0;
            auVar50._0_8_ = uVar26;
            auVar49 = vpmovzxbd_avx(auVar50);
            auVar49 = vcvtdq2ps_avx(auVar49);
            uVar41 = *(undefined4 *)(uVar44 + 0x44 + lVar39);
            auVar108._4_4_ = uVar41;
            auVar108._0_4_ = uVar41;
            auVar108._8_4_ = uVar41;
            auVar108._12_4_ = uVar41;
            uVar41 = *(undefined4 *)(uVar44 + 0x38 + lVar39);
            auVar115._4_4_ = uVar41;
            auVar115._0_4_ = uVar41;
            auVar115._8_4_ = uVar41;
            auVar115._12_4_ = uVar41;
            auVar59 = vfmadd213ps_fma(auVar49,auVar108,auVar115);
            auVar86._8_8_ = 0;
            auVar86._0_8_ = *(ulong *)(uVar44 + 0x50 + lVar39);
            auVar49 = vpmovzxbd_avx(auVar86);
            auVar49 = vcvtdq2ps_avx(auVar49);
            uVar41 = *(undefined4 *)(uVar44 + 0x74 + lVar39);
            auVar125._4_4_ = uVar41;
            auVar125._0_4_ = uVar41;
            auVar125._8_4_ = uVar41;
            auVar125._12_4_ = uVar41;
            uVar41 = *(undefined4 *)(uVar44 + 0x68 + lVar39);
            auVar132._4_4_ = uVar41;
            auVar132._0_4_ = uVar41;
            auVar132._8_4_ = uVar41;
            auVar132._12_4_ = uVar41;
            auVar70 = vfmadd213ps_fma(auVar49,auVar125,auVar132);
            auVar60._8_8_ = 0;
            auVar60._0_8_ = *(ulong *)(uVar44 + 0x24 + lVar39);
            auVar49 = vpmovzxbd_avx(auVar60);
            auVar49 = vcvtdq2ps_avx(auVar49);
            auVar83 = vfmadd213ps_fma(auVar49,auVar108,auVar115);
            auVar109._8_8_ = 0;
            auVar109._0_8_ = *(ulong *)(uVar44 + 0x54 + lVar39);
            auVar49 = vpmovzxbd_avx(auVar109);
            auVar49 = vcvtdq2ps_avx(auVar49);
            auVar96 = vfmadd213ps_fma(auVar49,auVar125,auVar132);
            auVar116._8_8_ = 0;
            auVar116._0_8_ = *(ulong *)(uVar44 + 0x28 + lVar39);
            auVar49 = vpmovzxbd_avx(auVar116);
            auVar49 = vcvtdq2ps_avx(auVar49);
            uVar41 = *(undefined4 *)(uVar44 + 0x48 + lVar39);
            auVar149._4_4_ = uVar41;
            auVar149._0_4_ = uVar41;
            auVar149._8_4_ = uVar41;
            auVar149._12_4_ = uVar41;
            uVar41 = *(undefined4 *)(uVar44 + 0x3c + lVar39);
            auVar155._4_4_ = uVar41;
            auVar155._0_4_ = uVar41;
            auVar155._8_4_ = uVar41;
            auVar155._12_4_ = uVar41;
            auVar97 = vfmadd213ps_fma(auVar49,auVar149,auVar155);
            auVar126._8_8_ = 0;
            auVar126._0_8_ = *(ulong *)(uVar44 + 0x58 + lVar39);
            auVar49 = vpmovzxbd_avx(auVar126);
            auVar49 = vcvtdq2ps_avx(auVar49);
            uVar41 = *(undefined4 *)(uVar44 + 0x78 + lVar39);
            auVar161._4_4_ = uVar41;
            auVar161._0_4_ = uVar41;
            auVar161._8_4_ = uVar41;
            auVar161._12_4_ = uVar41;
            uVar41 = *(undefined4 *)(uVar44 + 0x6c + lVar39);
            auVar167._4_4_ = uVar41;
            auVar167._0_4_ = uVar41;
            auVar167._8_4_ = uVar41;
            auVar167._12_4_ = uVar41;
            auVar48 = vfmadd213ps_fma(auVar49,auVar161,auVar167);
            auVar133._8_8_ = 0;
            auVar133._0_8_ = *(ulong *)(uVar44 + 0x2c + lVar39);
            auVar49 = vpmovzxbd_avx(auVar133);
            auVar49 = vcvtdq2ps_avx(auVar49);
            auVar71 = vfmadd213ps_fma(auVar49,auVar149,auVar155);
            auVar150._8_8_ = 0;
            auVar150._0_8_ = *(ulong *)(uVar44 + 0x5c + lVar39);
            auVar49 = vpmovzxbd_avx(auVar150);
            auVar49 = vcvtdq2ps_avx(auVar49);
            auVar72 = vfmadd213ps_fma(auVar49,auVar161,auVar167);
            auVar156._8_8_ = 0;
            auVar156._0_8_ = *(ulong *)(uVar44 + 0x30 + lVar39);
            auVar49 = vpmovzxbd_avx(auVar156);
            auVar49 = vcvtdq2ps_avx(auVar49);
            uVar41 = *(undefined4 *)(uVar44 + 0x4c + lVar39);
            auVar162._4_4_ = uVar41;
            auVar162._0_4_ = uVar41;
            auVar162._8_4_ = uVar41;
            auVar162._12_4_ = uVar41;
            uVar41 = *(undefined4 *)(uVar44 + 0x40 + lVar39);
            auVar168._4_4_ = uVar41;
            auVar168._0_4_ = uVar41;
            auVar168._8_4_ = uVar41;
            auVar168._12_4_ = uVar41;
            auVar84 = vfmadd213ps_fma(auVar49,auVar162,auVar168);
            auVar177._8_8_ = 0;
            auVar177._0_8_ = *(ulong *)(uVar44 + 0x60 + lVar39);
            auVar49 = vpmovzxbd_avx(auVar177);
            auVar49 = vcvtdq2ps_avx(auVar49);
            uVar41 = *(undefined4 *)(uVar44 + 0x7c + lVar39);
            auVar180._4_4_ = uVar41;
            auVar180._0_4_ = uVar41;
            auVar180._8_4_ = uVar41;
            auVar180._12_4_ = uVar41;
            auVar181._8_8_ = 0;
            auVar181._0_8_ = *(ulong *)(uVar44 + 0x34 + lVar39);
            auVar95 = vpmovzxbd_avx(auVar181);
            auVar95 = vcvtdq2ps_avx(auVar95);
            auVar95 = vfmadd213ps_fma(auVar95,auVar162,auVar168);
            uVar41 = *(undefined4 *)(uVar44 + 0x70 + lVar39);
            auVar163._4_4_ = uVar41;
            auVar163._0_4_ = uVar41;
            auVar163._8_4_ = uVar41;
            auVar163._12_4_ = uVar41;
            auVar85 = vfmadd213ps_fma(auVar49,auVar180,auVar163);
            auVar169._8_8_ = 0;
            auVar169._0_8_ = *(ulong *)(uVar44 + 100 + lVar39);
            auVar49 = vpmovzxbd_avx(auVar169);
            auVar49 = vcvtdq2ps_avx(auVar49);
            auVar98 = vfmadd213ps_fma(auVar49,auVar180,auVar163);
            fVar58 = ((ray->dir).field_0.m128[3] - *(float *)(uVar44 + 0x80 + lVar39)) *
                     *(float *)(uVar44 + 0x84 + lVar39);
            auVar164._4_4_ = fVar58;
            auVar164._0_4_ = fVar58;
            auVar164._8_4_ = fVar58;
            auVar164._12_4_ = fVar58;
            auVar49 = vsubps_avx(auVar70,auVar59);
            auVar59 = vfmadd213ps_fma(auVar49,auVar164,auVar59);
            auVar49 = vsubps_avx(auVar96,auVar83);
            auVar70 = vfmadd213ps_fma(auVar49,auVar164,auVar83);
            auVar49 = vsubps_avx(auVar48,auVar97);
            auVar83 = vfmadd213ps_fma(auVar49,auVar164,auVar97);
            auVar49 = vsubps_avx(auVar72,auVar71);
            auVar96 = vfmadd213ps_fma(auVar49,auVar164,auVar71);
            auVar49 = vsubps_avx(auVar85,auVar84);
            auVar97 = vfmadd213ps_fma(auVar49,auVar164,auVar84);
            auVar49 = vsubps_avx(auVar98,auVar95);
            auVar48 = vfmadd213ps_fma(auVar49,auVar164,auVar95);
            auVar49 = vpminub_avx(auVar50,auVar60);
            auVar51._8_8_ = 0;
            auVar51._0_8_ = uVar26;
            auVar49 = vpcmpeqb_avx(auVar51,auVar49);
            auVar95 = vsubps_avx(auVar59,local_be0);
            auVar61._0_4_ = local_c10 * auVar95._0_4_;
            auVar61._4_4_ = fStack_c0c * auVar95._4_4_;
            auVar61._8_4_ = fStack_c08 * auVar95._8_4_;
            auVar61._12_4_ = fStack_c04 * auVar95._12_4_;
            auVar95 = vsubps_avx(auVar83,local_bf0);
            auVar87._0_4_ = local_c20._0_4_ * auVar95._0_4_;
            auVar87._4_4_ = local_c20._4_4_ * auVar95._4_4_;
            auVar87._8_4_ = local_c20._8_4_ * auVar95._8_4_;
            auVar87._12_4_ = local_c20._12_4_ * auVar95._12_4_;
            auVar95 = vsubps_avx(auVar70,local_be0);
            auVar73._0_4_ = local_c40 * auVar95._0_4_;
            auVar73._4_4_ = fStack_c3c * auVar95._4_4_;
            auVar73._8_4_ = fStack_c38 * auVar95._8_4_;
            auVar73._12_4_ = fStack_c34 * auVar95._12_4_;
            auVar95 = vsubps_avx(auVar96,local_bf0);
            auVar99._0_4_ = local_c50._0_4_ * auVar95._0_4_;
            auVar99._4_4_ = local_c50._4_4_ * auVar95._4_4_;
            auVar99._8_4_ = local_c50._8_4_ * auVar95._8_4_;
            auVar99._12_4_ = local_c50._12_4_ * auVar95._12_4_;
            auVar59 = vpminsd_avx(auVar61,auVar73);
            auVar95 = vpmaxsd_avx(auVar61,auVar73);
            auVar70 = vpminsd_avx(auVar87,auVar99);
            auVar59 = vpmaxsd_avx(auVar59,auVar70);
            auVar70 = vpmaxsd_avx(auVar87,auVar99);
            auVar83 = vsubps_avx(auVar97,local_c00);
            auVar100._0_4_ = local_c30._0_4_ * auVar83._0_4_;
            auVar100._4_4_ = local_c30._4_4_ * auVar83._4_4_;
            auVar100._8_4_ = local_c30._8_4_ * auVar83._8_4_;
            auVar100._12_4_ = local_c30._12_4_ * auVar83._12_4_;
            auVar83 = vsubps_avx(auVar48,local_c00);
            auVar110._0_4_ = local_c60._0_4_ * auVar83._0_4_;
            auVar110._4_4_ = local_c60._4_4_ * auVar83._4_4_;
            auVar110._8_4_ = local_c60._8_4_ * auVar83._8_4_;
            auVar110._12_4_ = local_c60._12_4_ * auVar83._12_4_;
            auVar83 = vpminsd_avx(auVar95,auVar70);
            auVar70 = vpminsd_avx(auVar100,auVar110);
            auVar95 = vpmaxsd_avx(auVar100,auVar110);
            auVar70 = vpmaxsd_avx(auVar70,local_c70);
            auVar59 = vpmaxsd_avx(auVar59,auVar70);
            auVar95 = vpminsd_avx(auVar95,local_c80);
            auVar95 = vpminsd_avx(auVar83,auVar95);
            auVar95 = vpcmpgtd_avx(auVar59,auVar95);
            auVar49 = vpmovsxbd_avx(auVar49);
            auVar49 = vpandn_avx(auVar95,auVar49);
            uVar24 = vmovmskps_avx(auVar49);
            if (uVar24 != 0) {
              uVar26 = (ulong)(uVar24 & 0xff);
              pSVar30 = local_d48->scene;
              local_bc0 = lVar39 + uVar44;
              pRVar31 = ray;
              local_d40 = pSVar30;
              do {
                ray = local_ba8;
                uVar42 = local_bb0;
                local_ba0 = uVar26;
                lVar39 = 0;
                for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                  lVar39 = lVar39 + 1;
                }
                uVar2 = *(ushort *)(local_bc0 + lVar39 * 8);
                uVar3 = *(ushort *)(local_bc0 + 2 + lVar39 * 8);
                local_d28 = (ulong)*(uint *)(local_bc0 + 0x88);
                local_bc8 = (ulong)*(uint *)(local_bc0 + 4 + lVar39 * 8);
                pGVar29 = (pSVar30->geometries).items[local_d28].ptr;
                local_b88 = *(long *)&pGVar29->field_0x58;
                fVar58 = (pGVar29->time_range).lower;
                fVar58 = pGVar29->fnumTimeSegments *
                         (((pRVar31->dir).field_0.m128[3] - fVar58) /
                         ((pGVar29->time_range).upper - fVar58));
                auVar49 = vroundss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),9);
                auVar49 = vminss_avx(auVar49,ZEXT416((uint)(pGVar29->fnumTimeSegments + -1.0)));
                auVar59 = vmaxss_avx(ZEXT816(0) << 0x20,auVar49);
                local_b90 = pGVar29[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i * local_bc8;
                local_d30 = uVar2 & 0x7fff;
                local_d34 = uVar3 & 0x7fff;
                uVar24 = *(uint *)(local_b88 + 4 + local_b90);
                uVar35 = (ulong)uVar24;
                uVar34 = (ulong)(uVar24 * local_d34 + *(int *)(local_b88 + local_b90) + local_d30);
                lVar4 = *(long *)&pGVar29[2].numPrimitives;
                lVar36 = (long)(int)auVar59._0_4_ * 0x38;
                lVar5 = *(long *)(lVar4 + 0x10 + lVar36);
                lVar6 = *(long *)(lVar4 + lVar36);
                auVar49 = *(undefined1 (*) [16])(lVar6 + lVar5 * uVar34);
                lVar7 = *(long *)(lVar4 + 0x48 + lVar36);
                auVar70 = *(undefined1 (*) [16])(lVar6 + (uVar34 + 1) * lVar5);
                lVar39 = uVar34 + uVar35;
                auVar95 = *(undefined1 (*) [16])(lVar6 + lVar39 * lVar5);
                lVar43 = uVar34 + uVar35 + 1;
                auVar83 = *(undefined1 (*) [16])(lVar6 + lVar43 * lVar5);
                lVar27 = uVar34 + (-1 < (short)uVar2) + 1;
                auVar96 = *(undefined1 (*) [16])(lVar6 + lVar27 * lVar5);
                lVar32 = (ulong)(-1 < (short)uVar2) + lVar43;
                uVar33 = 0;
                if (-1 < (short)uVar3) {
                  uVar33 = uVar35;
                }
                auVar97 = *(undefined1 (*) [16])(lVar6 + lVar32 * lVar5);
                auVar48 = *(undefined1 (*) [16])(lVar6 + (lVar39 + uVar33) * lVar5);
                auVar71 = *(undefined1 (*) [16])(lVar6 + (lVar43 + uVar33) * lVar5);
                auVar72 = *(undefined1 (*) [16])(lVar6 + lVar5 * (uVar33 + lVar32));
                lVar4 = *(long *)(lVar4 + 0x38 + lVar36);
                fVar58 = fVar58 - auVar59._0_4_;
                auVar52._4_4_ = fVar58;
                auVar52._0_4_ = fVar58;
                auVar52._8_4_ = fVar58;
                auVar52._12_4_ = fVar58;
                auVar59 = vsubps_avx(*(undefined1 (*) [16])(lVar4 + lVar7 * uVar34),auVar49);
                auVar84 = vfmadd213ps_fma(auVar59,auVar52,auVar49);
                auVar49 = vsubps_avx(*(undefined1 (*) [16])(lVar4 + lVar7 * (uVar34 + 1)),auVar70);
                auVar85 = vfmadd213ps_fma(auVar49,auVar52,auVar70);
                auVar49 = vsubps_avx(*(undefined1 (*) [16])(lVar4 + lVar7 * lVar39),auVar95);
                auVar98 = vfmadd213ps_fma(auVar49,auVar52,auVar95);
                auVar49 = vsubps_avx(*(undefined1 (*) [16])(lVar4 + lVar7 * lVar43),auVar83);
                auVar50 = vfmadd213ps_fma(auVar49,auVar52,auVar83);
                auVar49 = vsubps_avx(*(undefined1 (*) [16])(lVar4 + lVar7 * lVar27),auVar96);
                auVar95 = vfmadd213ps_fma(auVar49,auVar52,auVar96);
                auVar49 = vsubps_avx(*(undefined1 (*) [16])(lVar4 + lVar7 * lVar32),auVar97);
                auVar51 = vfmadd213ps_fma(auVar49,auVar52,auVar97);
                auVar49 = vsubps_avx(*(undefined1 (*) [16])(lVar4 + lVar7 * (lVar39 + uVar33)),
                                     auVar48);
                auVar48 = vfmadd213ps_fma(auVar49,auVar52,auVar48);
                auVar49 = vsubps_avx(*(undefined1 (*) [16])(lVar4 + lVar7 * (lVar43 + uVar33)),
                                     auVar71);
                auVar71 = vfmadd213ps_fma(auVar49,auVar52,auVar71);
                auVar49 = vsubps_avx(*(undefined1 (*) [16])(lVar4 + (uVar33 + lVar32) * lVar7),
                                     auVar72);
                auVar72 = vfmadd213ps_fma(auVar49,auVar52,auVar72);
                auVar59 = vunpcklps_avx(auVar85,auVar51);
                auVar49 = vunpckhps_avx(auVar85,auVar51);
                auVar70 = vunpcklps_avx(auVar95,auVar50);
                auVar95 = vunpckhps_avx(auVar95,auVar50);
                auVar83 = vunpcklps_avx(auVar49,auVar95);
                auVar96 = vunpcklps_avx(auVar59,auVar70);
                auVar49 = vunpckhps_avx(auVar59,auVar70);
                auVar70 = vunpcklps_avx(auVar98,auVar71);
                auVar95 = vunpckhps_avx(auVar98,auVar71);
                auVar97 = vunpcklps_avx(auVar50,auVar48);
                auVar59 = vunpckhps_avx(auVar50,auVar48);
                auVar59 = vunpcklps_avx(auVar95,auVar59);
                auVar48 = vunpcklps_avx(auVar70,auVar97);
                auVar95 = vunpckhps_avx(auVar70,auVar97);
                auVar117._16_16_ = auVar71;
                auVar117._0_16_ = auVar98;
                auVar62._16_16_ = auVar51;
                auVar62._0_16_ = auVar85;
                auVar106 = vunpcklps_avx(auVar62,auVar117);
                auVar89._16_16_ = auVar72;
                auVar89._0_16_ = auVar50;
                auVar75._16_16_ = auVar50;
                auVar75._0_16_ = auVar84;
                auVar74 = vunpcklps_avx(auVar75,auVar89);
                auVar9 = vunpcklps_avx(auVar74,auVar106);
                auVar106 = vunpckhps_avx(auVar74,auVar106);
                auVar74 = vunpckhps_avx(auVar62,auVar117);
                auVar62 = vunpckhps_avx(auVar75,auVar89);
                auVar74 = vunpcklps_avx(auVar62,auVar74);
                auVar107._16_16_ = auVar96;
                auVar107._0_16_ = auVar96;
                auVar182._16_16_ = auVar49;
                auVar182._0_16_ = auVar49;
                auVar90._16_16_ = auVar83;
                auVar90._0_16_ = auVar83;
                auVar118._16_16_ = auVar48;
                auVar118._0_16_ = auVar48;
                auVar76._16_16_ = auVar95;
                auVar76._0_16_ = auVar95;
                auVar178._16_16_ = auVar59;
                auVar178._0_16_ = auVar59;
                uVar41 = *(undefined4 *)&(local_ba8->org).field_0;
                auVar101._4_4_ = uVar41;
                auVar101._0_4_ = uVar41;
                auVar101._8_4_ = uVar41;
                auVar101._12_4_ = uVar41;
                auVar101._16_4_ = uVar41;
                auVar101._20_4_ = uVar41;
                auVar101._24_4_ = uVar41;
                auVar101._28_4_ = uVar41;
                uVar41 = *(undefined4 *)((long)&(local_ba8->org).field_0 + 4);
                auVar151._4_4_ = uVar41;
                auVar151._0_4_ = uVar41;
                auVar151._8_4_ = uVar41;
                auVar151._12_4_ = uVar41;
                auVar151._16_4_ = uVar41;
                auVar151._20_4_ = uVar41;
                auVar151._24_4_ = uVar41;
                auVar151._28_4_ = uVar41;
                uVar41 = *(undefined4 *)((long)&(local_ba8->org).field_0 + 8);
                auVar165._4_4_ = uVar41;
                auVar165._0_4_ = uVar41;
                auVar165._8_4_ = uVar41;
                auVar165._12_4_ = uVar41;
                auVar165._16_4_ = uVar41;
                auVar165._20_4_ = uVar41;
                auVar165._24_4_ = uVar41;
                auVar165._28_4_ = uVar41;
                auVar62 = vsubps_avx(auVar9,auVar101);
                auVar9 = vsubps_avx(auVar106,auVar151);
                auVar75 = vsubps_avx(auVar74,auVar165);
                auVar106 = vsubps_avx(auVar107,auVar101);
                auVar74 = vsubps_avx(auVar182,auVar151);
                auVar93 = vsubps_avx(auVar90,auVar165);
                auVar107 = vsubps_avx(auVar118,auVar101);
                auVar76 = vsubps_avx(auVar76,auVar151);
                auVar123 = vsubps_avx(auVar178,auVar165);
                local_ac0 = vsubps_avx(auVar107,auVar62);
                local_980 = vsubps_avx(auVar76,auVar9);
                local_ae0 = vsubps_avx(auVar123,auVar75);
                auVar91._0_4_ = auVar107._0_4_ + auVar62._0_4_;
                auVar91._4_4_ = auVar107._4_4_ + auVar62._4_4_;
                auVar91._8_4_ = auVar107._8_4_ + auVar62._8_4_;
                auVar91._12_4_ = auVar107._12_4_ + auVar62._12_4_;
                auVar91._16_4_ = auVar107._16_4_ + auVar62._16_4_;
                auVar91._20_4_ = auVar107._20_4_ + auVar62._20_4_;
                auVar91._24_4_ = auVar107._24_4_ + auVar62._24_4_;
                auVar91._28_4_ = auVar107._28_4_ + auVar62._28_4_;
                auVar112._0_4_ = auVar76._0_4_ + auVar9._0_4_;
                auVar112._4_4_ = auVar76._4_4_ + auVar9._4_4_;
                auVar112._8_4_ = auVar76._8_4_ + auVar9._8_4_;
                auVar112._12_4_ = auVar76._12_4_ + auVar9._12_4_;
                auVar112._16_4_ = auVar76._16_4_ + auVar9._16_4_;
                auVar112._20_4_ = auVar76._20_4_ + auVar9._20_4_;
                auVar112._24_4_ = auVar76._24_4_ + auVar9._24_4_;
                auVar112._28_4_ = auVar76._28_4_ + auVar9._28_4_;
                fVar67 = auVar75._0_4_;
                auVar119._0_4_ = fVar67 + auVar123._0_4_;
                fVar137 = auVar75._4_4_;
                auVar119._4_4_ = fVar137 + auVar123._4_4_;
                fVar139 = auVar75._8_4_;
                auVar119._8_4_ = fVar139 + auVar123._8_4_;
                fVar141 = auVar75._12_4_;
                auVar119._12_4_ = fVar141 + auVar123._12_4_;
                fVar143 = auVar75._16_4_;
                auVar119._16_4_ = fVar143 + auVar123._16_4_;
                fVar145 = auVar75._20_4_;
                auVar119._20_4_ = fVar145 + auVar123._20_4_;
                fVar147 = auVar75._24_4_;
                auVar119._24_4_ = fVar147 + auVar123._24_4_;
                fVar68 = auVar75._28_4_;
                auVar119._28_4_ = fVar68 + auVar123._28_4_;
                auVar8._4_4_ = local_ae0._4_4_ * auVar112._4_4_;
                auVar8._0_4_ = local_ae0._0_4_ * auVar112._0_4_;
                auVar8._8_4_ = local_ae0._8_4_ * auVar112._8_4_;
                auVar8._12_4_ = local_ae0._12_4_ * auVar112._12_4_;
                auVar8._16_4_ = local_ae0._16_4_ * auVar112._16_4_;
                auVar8._20_4_ = local_ae0._20_4_ * auVar112._20_4_;
                auVar8._24_4_ = local_ae0._24_4_ * auVar112._24_4_;
                auVar8._28_4_ = auVar59._12_4_;
                auVar95 = vfmsub231ps_fma(auVar8,local_980,auVar119);
                auVar10._4_4_ = local_ac0._4_4_ * auVar119._4_4_;
                auVar10._0_4_ = local_ac0._0_4_ * auVar119._0_4_;
                auVar10._8_4_ = local_ac0._8_4_ * auVar119._8_4_;
                auVar10._12_4_ = local_ac0._12_4_ * auVar119._12_4_;
                auVar10._16_4_ = local_ac0._16_4_ * auVar119._16_4_;
                auVar10._20_4_ = local_ac0._20_4_ * auVar119._20_4_;
                auVar10._24_4_ = local_ac0._24_4_ * auVar119._24_4_;
                auVar10._28_4_ = auVar119._28_4_;
                auVar49 = vfmsub231ps_fma(auVar10,local_ae0,auVar91);
                auVar11._4_4_ = local_980._4_4_ * auVar91._4_4_;
                auVar11._0_4_ = local_980._0_4_ * auVar91._0_4_;
                auVar11._8_4_ = local_980._8_4_ * auVar91._8_4_;
                auVar11._12_4_ = local_980._12_4_ * auVar91._12_4_;
                auVar11._16_4_ = local_980._16_4_ * auVar91._16_4_;
                auVar11._20_4_ = local_980._20_4_ * auVar91._20_4_;
                auVar11._24_4_ = local_980._24_4_ * auVar91._24_4_;
                auVar11._28_4_ = auVar91._28_4_;
                local_d20._4_4_ = (local_ba8->dir).field_0.m128[2];
                auVar59 = vfmsub231ps_fma(auVar11,local_ac0,auVar112);
                auVar92._0_4_ = local_d20._4_4_ * auVar59._0_4_;
                auVar92._4_4_ = local_d20._4_4_ * auVar59._4_4_;
                auVar92._8_4_ = local_d20._4_4_ * auVar59._8_4_;
                auVar92._12_4_ = local_d20._4_4_ * auVar59._12_4_;
                auVar92._16_4_ = local_d20._4_4_ * 0.0;
                auVar92._20_4_ = local_d20._4_4_ * 0.0;
                auVar92._24_4_ = local_d20._4_4_ * 0.0;
                auVar92._28_4_ = 0;
                uVar41 = *(undefined4 *)((long)&(local_ba8->dir).field_0 + 4);
                auVar63._4_4_ = uVar41;
                auVar63._0_4_ = uVar41;
                auVar63._8_4_ = uVar41;
                auVar63._12_4_ = uVar41;
                auVar63._16_4_ = uVar41;
                auVar63._20_4_ = uVar41;
                auVar63._24_4_ = uVar41;
                auVar63._28_4_ = uVar41;
                auVar49 = vfmadd231ps_fma(auVar92,auVar63,ZEXT1632(auVar49));
                uVar41 = *(undefined4 *)&(local_ba8->dir).field_0;
                auVar183._4_4_ = uVar41;
                auVar183._0_4_ = uVar41;
                auVar183._8_4_ = uVar41;
                auVar183._12_4_ = uVar41;
                auVar183._16_4_ = uVar41;
                auVar183._20_4_ = uVar41;
                auVar183._24_4_ = uVar41;
                auVar183._28_4_ = uVar41;
                auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar183,ZEXT1632(auVar95));
                local_9a0 = vsubps_avx(auVar9,auVar74);
                local_9c0 = vsubps_avx(auVar75,auVar93);
                auVar113._0_4_ = auVar9._0_4_ + auVar74._0_4_;
                auVar113._4_4_ = auVar9._4_4_ + auVar74._4_4_;
                auVar113._8_4_ = auVar9._8_4_ + auVar74._8_4_;
                auVar113._12_4_ = auVar9._12_4_ + auVar74._12_4_;
                auVar113._16_4_ = auVar9._16_4_ + auVar74._16_4_;
                auVar113._20_4_ = auVar9._20_4_ + auVar74._20_4_;
                auVar113._24_4_ = auVar9._24_4_ + auVar74._24_4_;
                auVar113._28_4_ = auVar9._28_4_ + auVar74._28_4_;
                auVar120._0_4_ = fVar67 + auVar93._0_4_;
                auVar120._4_4_ = fVar137 + auVar93._4_4_;
                auVar120._8_4_ = fVar139 + auVar93._8_4_;
                auVar120._12_4_ = fVar141 + auVar93._12_4_;
                auVar120._16_4_ = fVar143 + auVar93._16_4_;
                auVar120._20_4_ = fVar145 + auVar93._20_4_;
                auVar120._24_4_ = fVar147 + auVar93._24_4_;
                auVar120._28_4_ = fVar68 + auVar93._28_4_;
                fVar58 = local_9c0._0_4_;
                fVar47 = local_9c0._4_4_;
                auVar12._4_4_ = auVar113._4_4_ * fVar47;
                auVar12._0_4_ = auVar113._0_4_ * fVar58;
                fVar55 = local_9c0._8_4_;
                auVar12._8_4_ = auVar113._8_4_ * fVar55;
                fVar57 = local_9c0._12_4_;
                auVar12._12_4_ = auVar113._12_4_ * fVar57;
                fVar69 = local_9c0._16_4_;
                auVar12._16_4_ = auVar113._16_4_ * fVar69;
                fVar81 = local_9c0._20_4_;
                auVar12._20_4_ = auVar113._20_4_ * fVar81;
                fVar65 = local_9c0._24_4_;
                auVar12._24_4_ = auVar113._24_4_ * fVar65;
                auVar12._28_4_ = fVar68;
                auVar59 = vfmsub231ps_fma(auVar12,local_9a0,auVar120);
                local_9e0 = vsubps_avx(auVar62,auVar106);
                fVar68 = local_9e0._0_4_;
                auVar83._0_4_ = local_9e0._4_4_;
                auVar13._4_4_ = auVar120._4_4_ * auVar83._0_4_;
                auVar13._0_4_ = auVar120._0_4_ * fVar68;
                fVar56 = local_9e0._8_4_;
                auVar13._8_4_ = auVar120._8_4_ * fVar56;
                auVar70._0_4_ = local_9e0._12_4_;
                auVar13._12_4_ = auVar120._12_4_ * auVar70._0_4_;
                fVar80 = local_9e0._16_4_;
                auVar13._16_4_ = auVar120._16_4_ * fVar80;
                fVar82 = local_9e0._20_4_;
                auVar13._20_4_ = auVar120._20_4_ * fVar82;
                fVar66 = local_9e0._24_4_;
                auVar13._24_4_ = auVar120._24_4_ * fVar66;
                auVar13._28_4_ = local_ac0._28_4_;
                auVar121._0_4_ = auVar62._0_4_ + auVar106._0_4_;
                auVar121._4_4_ = auVar62._4_4_ + auVar106._4_4_;
                auVar121._8_4_ = auVar62._8_4_ + auVar106._8_4_;
                auVar121._12_4_ = auVar62._12_4_ + auVar106._12_4_;
                auVar121._16_4_ = auVar62._16_4_ + auVar106._16_4_;
                auVar121._20_4_ = auVar62._20_4_ + auVar106._20_4_;
                auVar121._24_4_ = auVar62._24_4_ + auVar106._24_4_;
                auVar121._28_4_ = auVar62._28_4_ + auVar106._28_4_;
                auVar95 = vfmsub231ps_fma(auVar13,local_9c0,auVar121);
                fVar166 = local_9a0._0_4_;
                fVar171 = local_9a0._4_4_;
                auVar14._4_4_ = fVar171 * auVar121._4_4_;
                auVar14._0_4_ = fVar166 * auVar121._0_4_;
                fVar172 = local_9a0._8_4_;
                auVar14._8_4_ = fVar172 * auVar121._8_4_;
                fVar173 = local_9a0._12_4_;
                auVar14._12_4_ = fVar173 * auVar121._12_4_;
                fVar174 = local_9a0._16_4_;
                auVar14._16_4_ = fVar174 * auVar121._16_4_;
                fVar175 = local_9a0._20_4_;
                auVar14._20_4_ = fVar175 * auVar121._20_4_;
                fVar176 = local_9a0._24_4_;
                auVar14._24_4_ = fVar176 * auVar121._24_4_;
                auVar14._28_4_ = auVar121._28_4_;
                auVar96 = vfmsub231ps_fma(auVar14,local_9e0,auVar113);
                auVar122._0_4_ = local_d20._4_4_ * auVar96._0_4_;
                auVar122._4_4_ = local_d20._4_4_ * auVar96._4_4_;
                auVar122._8_4_ = local_d20._4_4_ * auVar96._8_4_;
                auVar122._12_4_ = local_d20._4_4_ * auVar96._12_4_;
                auVar122._16_4_ = local_d20._4_4_ * 0.0;
                auVar122._20_4_ = local_d20._4_4_ * 0.0;
                auVar122._24_4_ = local_d20._4_4_ * 0.0;
                auVar122._28_4_ = 0;
                auVar95 = vfmadd231ps_fma(auVar122,auVar63,ZEXT1632(auVar95));
                auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar183,ZEXT1632(auVar59));
                auVar8 = vsubps_avx(auVar106,auVar107);
                auVar102._0_4_ = auVar106._0_4_ + auVar107._0_4_;
                auVar102._4_4_ = auVar106._4_4_ + auVar107._4_4_;
                auVar102._8_4_ = auVar106._8_4_ + auVar107._8_4_;
                auVar102._12_4_ = auVar106._12_4_ + auVar107._12_4_;
                auVar102._16_4_ = auVar106._16_4_ + auVar107._16_4_;
                auVar102._20_4_ = auVar106._20_4_ + auVar107._20_4_;
                auVar102._24_4_ = auVar106._24_4_ + auVar107._24_4_;
                auVar102._28_4_ = auVar106._28_4_ + auVar107._28_4_;
                auVar107 = vsubps_avx(auVar74,auVar76);
                auVar127._0_4_ = auVar74._0_4_ + auVar76._0_4_;
                auVar127._4_4_ = auVar74._4_4_ + auVar76._4_4_;
                auVar127._8_4_ = auVar74._8_4_ + auVar76._8_4_;
                auVar127._12_4_ = auVar74._12_4_ + auVar76._12_4_;
                auVar127._16_4_ = auVar74._16_4_ + auVar76._16_4_;
                auVar127._20_4_ = auVar74._20_4_ + auVar76._20_4_;
                auVar127._24_4_ = auVar74._24_4_ + auVar76._24_4_;
                auVar127._28_4_ = auVar74._28_4_ + auVar76._28_4_;
                auVar76 = vsubps_avx(auVar93,auVar123);
                auVar77._0_4_ = auVar93._0_4_ + auVar123._0_4_;
                auVar77._4_4_ = auVar93._4_4_ + auVar123._4_4_;
                auVar77._8_4_ = auVar93._8_4_ + auVar123._8_4_;
                auVar77._12_4_ = auVar93._12_4_ + auVar123._12_4_;
                auVar77._16_4_ = auVar93._16_4_ + auVar123._16_4_;
                auVar77._20_4_ = auVar93._20_4_ + auVar123._20_4_;
                auVar77._24_4_ = auVar93._24_4_ + auVar123._24_4_;
                auVar77._28_4_ = auVar93._28_4_ + auVar123._28_4_;
                auVar134._0_4_ = auVar127._0_4_ * auVar76._0_4_;
                auVar134._4_4_ = auVar127._4_4_ * auVar76._4_4_;
                auVar134._8_4_ = auVar127._8_4_ * auVar76._8_4_;
                auVar134._12_4_ = auVar127._12_4_ * auVar76._12_4_;
                auVar134._16_4_ = auVar127._16_4_ * auVar76._16_4_;
                auVar134._20_4_ = auVar127._20_4_ * auVar76._20_4_;
                auVar134._24_4_ = auVar127._24_4_ * auVar76._24_4_;
                auVar134._28_4_ = 0;
                auVar96 = vfmsub231ps_fma(auVar134,auVar107,auVar77);
                auVar93._4_4_ = auVar77._4_4_ * auVar8._4_4_;
                auVar93._0_4_ = auVar77._0_4_ * auVar8._0_4_;
                auVar93._8_4_ = auVar77._8_4_ * auVar8._8_4_;
                auVar93._12_4_ = auVar77._12_4_ * auVar8._12_4_;
                auVar93._16_4_ = auVar77._16_4_ * auVar8._16_4_;
                auVar93._20_4_ = auVar77._20_4_ * auVar8._20_4_;
                auVar93._24_4_ = auVar77._24_4_ * auVar8._24_4_;
                auVar93._28_4_ = auVar77._28_4_;
                auVar59 = vfmsub231ps_fma(auVar93,auVar76,auVar102);
                auVar123._4_4_ = auVar102._4_4_ * auVar107._4_4_;
                auVar123._0_4_ = auVar102._0_4_ * auVar107._0_4_;
                auVar123._8_4_ = auVar102._8_4_ * auVar107._8_4_;
                auVar123._12_4_ = auVar102._12_4_ * auVar107._12_4_;
                auVar123._16_4_ = auVar102._16_4_ * auVar107._16_4_;
                auVar123._20_4_ = auVar102._20_4_ * auVar107._20_4_;
                auVar123._24_4_ = auVar102._24_4_ * auVar107._24_4_;
                auVar123._28_4_ = auVar102._28_4_;
                auVar97 = vfmsub231ps_fma(auVar123,auVar8,auVar127);
                local_d20._0_4_ = local_d20._4_4_;
                auStack_d18._0_4_ = local_d20._4_4_;
                auStack_d18._4_4_ = local_d20._4_4_;
                fStack_d10 = local_d20._4_4_;
                fStack_d0c = local_d20._4_4_;
                fStack_d08 = local_d20._4_4_;
                fStack_d04 = local_d20._4_4_;
                auVar103._0_4_ = local_d20._4_4_ * auVar97._0_4_;
                auVar103._4_4_ = local_d20._4_4_ * auVar97._4_4_;
                auVar103._8_4_ = local_d20._4_4_ * auVar97._8_4_;
                auVar103._12_4_ = local_d20._4_4_ * auVar97._12_4_;
                auVar103._16_4_ = local_d20._4_4_ * 0.0;
                auVar103._20_4_ = local_d20._4_4_ * 0.0;
                auVar103._24_4_ = local_d20._4_4_ * 0.0;
                auVar103._28_4_ = 0;
                auVar59 = vfmadd231ps_fma(auVar103,auVar63,ZEXT1632(auVar59));
                auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),auVar183,ZEXT1632(auVar96));
                fVar154 = auVar59._0_4_ + auVar49._0_4_ + auVar95._0_4_;
                fVar158 = auVar59._4_4_ + auVar49._4_4_ + auVar95._4_4_;
                fVar159 = auVar59._8_4_ + auVar49._8_4_ + auVar95._8_4_;
                fVar160 = auVar59._12_4_ + auVar49._12_4_ + auVar95._12_4_;
                local_ca0 = ZEXT1632(CONCAT412(fVar160,CONCAT48(fVar159,CONCAT44(fVar158,fVar154))))
                ;
                auVar93 = ZEXT1632(auVar49);
                auVar106 = vminps_avx(auVar93,ZEXT1632(auVar95));
                auVar106 = vminps_avx(auVar106,ZEXT1632(auVar59));
                auVar78._8_4_ = 0x7fffffff;
                auVar78._0_8_ = 0x7fffffff7fffffff;
                auVar78._12_4_ = 0x7fffffff;
                auVar78._16_4_ = 0x7fffffff;
                auVar78._20_4_ = 0x7fffffff;
                auVar78._24_4_ = 0x7fffffff;
                auVar78._28_4_ = 0x7fffffff;
                local_a80 = vandps_avx(local_ca0,auVar78);
                fVar131 = local_a80._0_4_ * 1.1920929e-07;
                fVar138 = local_a80._4_4_ * 1.1920929e-07;
                auVar15._4_4_ = fVar138;
                auVar15._0_4_ = fVar131;
                fVar140 = local_a80._8_4_ * 1.1920929e-07;
                auVar15._8_4_ = fVar140;
                fVar142 = local_a80._12_4_ * 1.1920929e-07;
                auVar15._12_4_ = fVar142;
                fVar144 = local_a80._16_4_ * 1.1920929e-07;
                auVar15._16_4_ = fVar144;
                fVar146 = local_a80._20_4_ * 1.1920929e-07;
                auVar15._20_4_ = fVar146;
                fVar148 = local_a80._24_4_ * 1.1920929e-07;
                auVar15._24_4_ = fVar148;
                auVar15._28_4_ = 0x34000000;
                auVar152._0_8_ = CONCAT44(fVar138,fVar131) ^ 0x8000000080000000;
                auVar152._8_4_ = -fVar140;
                auVar152._12_4_ = -fVar142;
                auVar152._16_4_ = -fVar144;
                auVar152._20_4_ = -fVar146;
                auVar152._24_4_ = -fVar148;
                auVar152._28_4_ = 0xb4000000;
                auVar106 = vcmpps_avx(auVar106,auVar152,5);
                auVar123 = ZEXT1632(auVar95);
                auVar74 = vmaxps_avx(auVar93,auVar123);
                auVar74 = vmaxps_avx(auVar74,ZEXT1632(auVar59));
                auVar74 = vcmpps_avx(auVar74,auVar15,2);
                local_a00 = vorps_avx(auVar106,auVar74);
                auVar74 = local_aa0 & local_a00;
                pSVar30 = local_d40;
                uVar33 = local_d50;
                uVar34 = local_d58;
                uVar35 = local_d60;
                uVar37 = local_d68;
                uVar38 = local_d70;
                if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar74 >> 0x7f,0) != '\0') ||
                      (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar74 >> 0xbf,0) != '\0') ||
                    (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar74[0x1f] < '\0') {
                  auVar16._4_4_ = local_ae0._4_4_ * fVar171;
                  auVar16._0_4_ = local_ae0._0_4_ * fVar166;
                  auVar16._8_4_ = local_ae0._8_4_ * fVar172;
                  auVar16._12_4_ = local_ae0._12_4_ * fVar173;
                  auVar16._16_4_ = local_ae0._16_4_ * fVar174;
                  auVar16._20_4_ = local_ae0._20_4_ * fVar175;
                  auVar16._24_4_ = local_ae0._24_4_ * fVar176;
                  auVar16._28_4_ = local_a00._28_4_;
                  local_a20 = 0x80000000;
                  uStack_a1c = 0x80000000;
                  uStack_a18 = 0x80000000;
                  uStack_a14 = 0x80000000;
                  uStack_a10 = 0x80000000;
                  uStack_a0c = 0x80000000;
                  uStack_a08 = 0x80000000;
                  uStack_a04 = 0x80000000;
                  auVar17._4_4_ = local_980._4_4_ * auVar83._0_4_;
                  auVar17._0_4_ = local_980._0_4_ * fVar68;
                  auVar17._8_4_ = local_980._8_4_ * fVar56;
                  auVar17._12_4_ = local_980._12_4_ * auVar70._0_4_;
                  auVar17._16_4_ = local_980._16_4_ * fVar80;
                  auVar17._20_4_ = local_980._20_4_ * fVar82;
                  auVar17._24_4_ = local_980._24_4_ * fVar66;
                  auVar17._28_4_ = auVar106._28_4_;
                  auVar49 = vfmsub213ps_fma(local_980,local_9c0,auVar16);
                  auVar18._4_4_ = fVar47 * auVar107._4_4_;
                  auVar18._0_4_ = fVar58 * auVar107._0_4_;
                  auVar18._8_4_ = fVar55 * auVar107._8_4_;
                  auVar18._12_4_ = fVar57 * auVar107._12_4_;
                  auVar18._16_4_ = fVar69 * auVar107._16_4_;
                  auVar18._20_4_ = fVar81 * auVar107._20_4_;
                  auVar18._24_4_ = fVar65 * auVar107._24_4_;
                  auVar18._28_4_ = 0x34000000;
                  auVar19._4_4_ = auVar83._0_4_ * auVar76._4_4_;
                  auVar19._0_4_ = fVar68 * auVar76._0_4_;
                  auVar19._8_4_ = fVar56 * auVar76._8_4_;
                  auVar19._12_4_ = auVar70._0_4_ * auVar76._12_4_;
                  auVar19._16_4_ = fVar80 * auVar76._16_4_;
                  auVar19._20_4_ = fVar82 * auVar76._20_4_;
                  auVar19._24_4_ = fVar66 * auVar76._24_4_;
                  auVar19._28_4_ = 0;
                  auVar59 = vfmsub213ps_fma(auVar76,local_9a0,auVar18);
                  auVar106 = vandps_avx(auVar16,auVar78);
                  auVar74 = vandps_avx(auVar18,auVar78);
                  auVar106 = vcmpps_avx(auVar106,auVar74,1);
                  auVar76 = vblendvps_avx(ZEXT1632(auVar59),ZEXT1632(auVar49),auVar106);
                  auVar20._4_4_ = fVar171 * auVar8._4_4_;
                  auVar20._0_4_ = fVar166 * auVar8._0_4_;
                  auVar20._8_4_ = fVar172 * auVar8._8_4_;
                  auVar20._12_4_ = fVar173 * auVar8._12_4_;
                  auVar20._16_4_ = fVar174 * auVar8._16_4_;
                  auVar20._20_4_ = fVar175 * auVar8._20_4_;
                  auVar20._24_4_ = fVar176 * auVar8._24_4_;
                  auVar20._28_4_ = auVar106._28_4_;
                  auVar49 = vfmsub213ps_fma(auVar8,local_9c0,auVar19);
                  auVar53._0_4_ = local_ac0._0_4_ * fVar58;
                  auVar53._4_4_ = local_ac0._4_4_ * fVar47;
                  auVar53._8_4_ = local_ac0._8_4_ * fVar55;
                  auVar53._12_4_ = local_ac0._12_4_ * fVar57;
                  auVar53._16_4_ = local_ac0._16_4_ * fVar69;
                  auVar53._20_4_ = local_ac0._20_4_ * fVar81;
                  auVar53._24_4_ = local_ac0._24_4_ * fVar65;
                  auVar53._28_4_ = 0;
                  auVar59 = vfmsub213ps_fma(local_ae0,local_9e0,auVar53);
                  auVar106 = vandps_avx(auVar53,auVar78);
                  auVar74 = vandps_avx(auVar19,auVar78);
                  auVar106 = vcmpps_avx(auVar106,auVar74,1);
                  auVar8 = vblendvps_avx(ZEXT1632(auVar49),ZEXT1632(auVar59),auVar106);
                  auVar49 = vfmsub213ps_fma(local_ac0,local_9a0,auVar17);
                  auVar59 = vfmsub213ps_fma(auVar107,local_9e0,auVar20);
                  auVar106 = vandps_avx(auVar17,auVar78);
                  auVar74 = vandps_avx(auVar20,auVar78);
                  auVar74 = vcmpps_avx(auVar106,auVar74,1);
                  auVar106 = vblendvps_avx(ZEXT1632(auVar59),ZEXT1632(auVar49),auVar74);
                  fVar68 = auVar106._0_4_;
                  fVar47 = auVar106._4_4_;
                  auVar21._4_4_ = fVar47 * local_d20._4_4_;
                  auVar21._0_4_ = fVar68 * local_d20._4_4_;
                  auVar83._0_4_ = auVar106._8_4_;
                  auVar21._8_4_ = auVar83._0_4_ * local_d20._4_4_;
                  fVar55 = auVar106._12_4_;
                  auVar21._12_4_ = fVar55 * local_d20._4_4_;
                  fVar56 = auVar106._16_4_;
                  auVar21._16_4_ = fVar56 * local_d20._4_4_;
                  fVar57 = auVar106._20_4_;
                  auVar21._20_4_ = fVar57 * local_d20._4_4_;
                  auVar70._0_4_ = auVar106._24_4_;
                  auVar21._24_4_ = auVar70._0_4_ * local_d20._4_4_;
                  auVar21._28_4_ = auVar74._28_4_;
                  auVar49 = vfmadd213ps_fma(auVar63,auVar8,auVar21);
                  auVar49 = vfmadd213ps_fma(auVar183,auVar76,ZEXT1632(auVar49));
                  fVar69 = auVar49._0_4_ + auVar49._0_4_;
                  fVar80 = auVar49._4_4_ + auVar49._4_4_;
                  fVar81 = auVar49._8_4_ + auVar49._8_4_;
                  fVar82 = auVar49._12_4_ + auVar49._12_4_;
                  auVar107 = ZEXT1632(CONCAT412(fVar82,CONCAT48(fVar81,CONCAT44(fVar80,fVar69))));
                  auVar104._0_4_ = fVar68 * fVar67;
                  auVar104._4_4_ = fVar47 * fVar137;
                  auVar104._8_4_ = auVar83._0_4_ * fVar139;
                  auVar104._12_4_ = fVar55 * fVar141;
                  auVar104._16_4_ = fVar56 * fVar143;
                  auVar104._20_4_ = fVar57 * fVar145;
                  auVar104._24_4_ = auVar70._0_4_ * fVar147;
                  auVar104._28_4_ = 0;
                  auVar49 = vfmadd213ps_fma(auVar9,auVar8,auVar104);
                  auVar106 = vrcpps_avx(auVar107);
                  auVar59 = vfmadd213ps_fma(auVar62,auVar76,ZEXT1632(auVar49));
                  auVar135._8_4_ = 0x3f800000;
                  auVar135._0_8_ = &DAT_3f8000003f800000;
                  auVar135._12_4_ = 0x3f800000;
                  auVar135._16_4_ = 0x3f800000;
                  auVar135._20_4_ = 0x3f800000;
                  auVar135._24_4_ = 0x3f800000;
                  auVar135._28_4_ = 0x3f800000;
                  auVar49 = vfnmadd213ps_fma(auVar106,auVar107,auVar135);
                  auVar49 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar106,auVar106);
                  local_880 = ZEXT1632(CONCAT412((auVar59._12_4_ + auVar59._12_4_) * auVar49._12_4_,
                                                 CONCAT48((auVar59._8_4_ + auVar59._8_4_) *
                                                          auVar49._8_4_,
                                                          CONCAT44((auVar59._4_4_ + auVar59._4_4_) *
                                                                   auVar49._4_4_,
                                                                   (auVar59._0_4_ + auVar59._0_4_) *
                                                                   auVar49._0_4_))));
                  uVar41 = *(undefined4 *)((long)&(local_ba8->org).field_0 + 0xc);
                  auVar105._4_4_ = uVar41;
                  auVar105._0_4_ = uVar41;
                  auVar105._8_4_ = uVar41;
                  auVar105._12_4_ = uVar41;
                  auVar105._16_4_ = uVar41;
                  auVar105._20_4_ = uVar41;
                  auVar105._24_4_ = uVar41;
                  auVar105._28_4_ = uVar41;
                  auVar106 = vcmpps_avx(auVar105,local_880,2);
                  fVar58 = local_ba8->tfar;
                  auVar128._4_4_ = fVar58;
                  auVar128._0_4_ = fVar58;
                  auVar128._8_4_ = fVar58;
                  auVar128._12_4_ = fVar58;
                  auVar128._16_4_ = fVar58;
                  auVar128._20_4_ = fVar58;
                  auVar128._24_4_ = fVar58;
                  auVar128._28_4_ = fVar58;
                  auVar74 = vcmpps_avx(local_880,auVar128,2);
                  auVar106 = vandps_avx(auVar74,auVar106);
                  auVar129._0_8_ = CONCAT44(fVar80,fVar69) ^ 0x8000000080000000;
                  auVar129._8_4_ = -fVar81;
                  auVar129._12_4_ = -fVar82;
                  auVar129._16_4_ = 0x80000000;
                  auVar129._20_4_ = 0x80000000;
                  auVar129._24_4_ = 0x80000000;
                  auVar129._28_4_ = 0x80000000;
                  auVar74 = vcmpps_avx(auVar107,auVar129,4);
                  auVar106 = vandps_avx(auVar74,auVar106);
                  auVar74 = vandps_avx(local_a00,local_aa0);
                  auVar106 = vpslld_avx2(auVar106,0x1f);
                  auVar107 = vpsrad_avx2(auVar106,0x1f);
                  auVar106 = auVar74 & auVar107;
                  if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar106 >> 0x7f,0) != '\0') ||
                        (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar106 >> 0xbf,0) != '\0') ||
                      (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar106[0x1f] < '\0') {
                    local_8e0 = vandps_avx(auVar107,auVar74);
                    local_920 = local_ca0;
                    local_900 = &local_d79;
                    auVar106 = vsubps_avx(local_ca0,auVar123);
                    auVar106 = vblendvps_avx(auVar93,auVar106,local_a40);
                    auVar74 = vsubps_avx(local_ca0,auVar93);
                    auVar74 = vblendvps_avx(auVar123,auVar74,local_a40);
                    local_860._0_4_ = auVar76._0_4_ * (float)local_a60._0_4_;
                    local_860._4_4_ = auVar76._4_4_ * (float)local_a60._4_4_;
                    local_860._8_4_ = auVar76._8_4_ * fStack_a58;
                    local_860._12_4_ = auVar76._12_4_ * fStack_a54;
                    local_860._16_4_ = auVar76._16_4_ * fStack_a50;
                    local_860._20_4_ = auVar76._20_4_ * fStack_a4c;
                    local_860._24_4_ = auVar76._24_4_ * fStack_a48;
                    local_860._28_4_ = 0;
                    local_840[0] = (float)local_a60._0_4_ * auVar8._0_4_;
                    local_840[1] = (float)local_a60._4_4_ * auVar8._4_4_;
                    local_840[2] = fStack_a58 * auVar8._8_4_;
                    local_840[3] = fStack_a54 * auVar8._12_4_;
                    fStack_830 = fStack_a50 * auVar8._16_4_;
                    fStack_82c = fStack_a4c * auVar8._20_4_;
                    fStack_828 = fStack_a48 * auVar8._24_4_;
                    uStack_824 = auVar8._28_4_;
                    local_820[0] = (float)local_a60._0_4_ * fVar68;
                    local_820[1] = (float)local_a60._4_4_ * fVar47;
                    local_820[2] = fStack_a58 * auVar83._0_4_;
                    local_820[3] = fStack_a54 * fVar55;
                    fStack_810 = fStack_a50 * fVar56;
                    fStack_80c = fStack_a4c * fVar57;
                    fStack_808 = fStack_a48 * auVar70._0_4_;
                    uStack_804 = auVar8._28_4_;
                    auVar54._0_8_ = (ulong)CONCAT24(uVar2,(uint)uVar2) & 0x7fff00007fff;
                    auVar54._8_4_ = local_d30;
                    auVar54._12_4_ = local_d30;
                    auVar54._16_4_ = local_d30;
                    auVar54._20_4_ = local_d30;
                    auVar54._24_4_ = local_d30;
                    auVar54._28_4_ = local_d30;
                    auVar93 = vpaddd_avx2(auVar54,_DAT_0205d4c0);
                    auVar64._0_8_ = (ulong)CONCAT24(uVar3,(uint)uVar3) & 0x7fff00007fff;
                    auVar64._8_4_ = local_d34;
                    auVar64._12_4_ = local_d34;
                    auVar64._16_4_ = local_d34;
                    auVar64._20_4_ = local_d34;
                    auVar64._24_4_ = local_d34;
                    auVar64._28_4_ = local_d34;
                    auVar107 = vpaddd_avx2(auVar64,_DAT_0205d4e0);
                    auVar88._0_4_ = (float)(int)(*(ushort *)(local_b88 + 8 + local_b90) - 1);
                    auVar88._4_12_ = auVar95._4_12_;
                    auVar49 = vrcpss_avx(auVar88,auVar88);
                    auVar59 = vfnmadd213ss_fma(auVar88,auVar49,SUB6416(ZEXT464(0x40000000),0));
                    fVar58 = auVar49._0_4_ * auVar59._0_4_;
                    auVar111._0_4_ = (float)(int)(*(ushort *)(local_b88 + 10 + local_b90) - 1);
                    auVar111._4_12_ = auVar95._4_12_;
                    auVar49 = vrcpss_avx(auVar111,auVar111);
                    auVar95 = vfnmadd213ss_fma(auVar111,auVar49,SUB6416(ZEXT464(0x40000000),0));
                    fVar68 = auVar49._0_4_ * auVar95._0_4_;
                    auVar93 = vcvtdq2ps_avx(auVar93);
                    fVar69 = auVar93._28_4_ + auVar106._28_4_;
                    fVar47 = (fVar154 * auVar93._0_4_ + auVar106._0_4_) * fVar58;
                    auVar83._0_4_ = (fVar158 * auVar93._4_4_ + auVar106._4_4_) * fVar58;
                    local_960._4_4_ = auVar83._0_4_;
                    local_960._0_4_ = fVar47;
                    fVar55 = (fVar159 * auVar93._8_4_ + auVar106._8_4_) * fVar58;
                    local_960._8_4_ = fVar55;
                    fVar56 = (fVar160 * auVar93._12_4_ + auVar106._12_4_) * fVar58;
                    local_960._12_4_ = fVar56;
                    fVar57 = (auVar93._16_4_ * 0.0 + auVar106._16_4_) * fVar58;
                    local_960._16_4_ = fVar57;
                    auVar70._0_4_ = (auVar93._20_4_ * 0.0 + auVar106._20_4_) * fVar58;
                    local_960._20_4_ = auVar70._0_4_;
                    fVar58 = (auVar93._24_4_ * 0.0 + auVar106._24_4_) * fVar58;
                    local_960._24_4_ = fVar58;
                    local_960._28_4_ = fVar69;
                    auVar106 = vcvtdq2ps_avx(auVar107);
                    fVar80 = (fVar154 * auVar106._0_4_ + auVar74._0_4_) * fVar68;
                    fVar81 = (fVar158 * auVar106._4_4_ + auVar74._4_4_) * fVar68;
                    local_940._4_4_ = fVar81;
                    local_940._0_4_ = fVar80;
                    fVar82 = (fVar159 * auVar106._8_4_ + auVar74._8_4_) * fVar68;
                    local_940._8_4_ = fVar82;
                    fVar65 = (fVar160 * auVar106._12_4_ + auVar74._12_4_) * fVar68;
                    local_940._12_4_ = fVar65;
                    fVar66 = (auVar106._16_4_ * 0.0 + auVar74._16_4_) * fVar68;
                    local_940._16_4_ = fVar66;
                    fVar67 = (auVar106._20_4_ * 0.0 + auVar74._20_4_) * fVar68;
                    local_940._20_4_ = fVar67;
                    fVar68 = (auVar106._24_4_ * 0.0 + auVar74._24_4_) * fVar68;
                    local_940._24_4_ = fVar68;
                    local_940._28_4_ = auVar106._28_4_ + auVar74._28_4_;
                    pGVar29 = (local_d40->geometries).items[local_d28].ptr;
                    if ((pGVar29->mask & local_ba8->mask) != 0) {
                      pRVar40 = local_d48->args;
                      if ((pRVar40->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar29->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00520e93:
                        auVar136 = ZEXT1664(local_be0);
                        auVar153 = ZEXT1664(local_bf0);
                        auVar157 = ZEXT1664(local_c00);
                        auVar170 = ZEXT1664(local_c20);
                        auVar179 = ZEXT1664(local_c30);
                        auVar184 = ZEXT1664(local_c50);
                        auVar124 = ZEXT1664(local_c60);
                        auVar114 = ZEXT1664(local_c70);
                        auVar130 = ZEXT1664(local_c80);
                        auVar83._0_4_ = local_c10;
                        fVar58 = fStack_c0c;
                        fVar68 = fStack_c08;
                        fVar47 = fStack_c04;
                        auVar70._0_4_ = local_c40;
                        fVar55 = fStack_c3c;
                        fVar56 = fStack_c38;
                        fVar57 = fStack_c34;
                        goto LAB_00520ef6;
                      }
                      auVar106 = vrcpps_avx(local_ca0);
                      auVar94._8_4_ = 0x3f800000;
                      auVar94._0_8_ = &DAT_3f8000003f800000;
                      auVar94._12_4_ = 0x3f800000;
                      auVar94._16_4_ = 0x3f800000;
                      auVar94._20_4_ = 0x3f800000;
                      auVar94._24_4_ = 0x3f800000;
                      auVar94._28_4_ = 0x3f800000;
                      auVar49 = vfnmadd213ps_fma(local_ca0,auVar106,auVar94);
                      auVar49 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar106,auVar106);
                      auVar79._8_4_ = 0x219392ef;
                      auVar79._0_8_ = 0x219392ef219392ef;
                      auVar79._12_4_ = 0x219392ef;
                      auVar79._16_4_ = 0x219392ef;
                      auVar79._20_4_ = 0x219392ef;
                      auVar79._24_4_ = 0x219392ef;
                      auVar79._28_4_ = 0x219392ef;
                      auVar106 = vcmpps_avx(local_a80,auVar79,5);
                      auVar106 = vandps_avx(ZEXT1632(auVar49),auVar106);
                      auVar22._4_4_ = auVar83._0_4_ * auVar106._4_4_;
                      auVar22._0_4_ = fVar47 * auVar106._0_4_;
                      auVar22._8_4_ = fVar55 * auVar106._8_4_;
                      auVar22._12_4_ = fVar56 * auVar106._12_4_;
                      auVar22._16_4_ = fVar57 * auVar106._16_4_;
                      auVar22._20_4_ = auVar70._0_4_ * auVar106._20_4_;
                      auVar22._24_4_ = fVar58 * auVar106._24_4_;
                      auVar22._28_4_ = fVar69;
                      local_8c0 = vminps_avx(auVar22,auVar94);
                      auVar23._4_4_ = fVar81 * auVar106._4_4_;
                      auVar23._0_4_ = fVar80 * auVar106._0_4_;
                      auVar23._8_4_ = fVar82 * auVar106._8_4_;
                      auVar23._12_4_ = fVar65 * auVar106._12_4_;
                      auVar23._16_4_ = fVar66 * auVar106._16_4_;
                      auVar23._20_4_ = fVar67 * auVar106._20_4_;
                      auVar23._24_4_ = fVar68 * auVar106._24_4_;
                      auVar23._28_4_ = local_8c0._28_4_;
                      local_8a0 = vminps_avx(auVar23,auVar94);
                      uVar24 = vmovmskps_avx(local_8e0);
                      local_d00._1_31_ = auVar75._1_31_;
                      local_d00[0] = uVar24 == 0;
                      if (uVar24 != 0) {
                        uVar28 = CONCAT44(0,uVar24 & 0xff);
                        auStack_cd8 = auVar183._8_24_;
                        local_ce0 = uVar28;
                        uVar26 = 0;
                        for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                          uVar26 = uVar26 + 1;
                        }
                        local_d20 = uVar26;
                        auStack_cb8 = auVar63._8_24_;
                        local_cc0 = local_d48->user;
                        auStack_b58 = auVar62._8_24_;
                        local_b60 = pGVar29;
                        auStack_b78 = auVar9._8_24_;
                        local_b80 = pRVar40;
                        do {
                          local_b34 = *(undefined4 *)(local_8c0 + uVar26 * 4);
                          local_b30 = *(undefined4 *)(local_8a0 + uVar26 * 4);
                          local_ca0._0_4_ = ray->tfar;
                          ray->tfar = *(float *)(local_880 + uVar26 * 4);
                          local_d20 = uVar26;
                          local_b40 = *(undefined4 *)(local_860 + uVar26 * 4);
                          local_b3c = local_840[uVar26];
                          local_b38 = local_820[uVar26];
                          local_b2c = (int)local_bc8;
                          local_b28 = (int)local_d28;
                          local_b24 = local_cc0->instID[0];
                          local_b20 = local_cc0->instPrimID[0];
                          local_d2c = -1;
                          local_b10.valid = &local_d2c;
                          local_b10.geometryUserPtr = pGVar29->userPtr;
                          local_b10.context = local_cc0;
                          local_b10.ray = (RTCRayN *)ray;
                          local_b10.hit = (RTCHitN *)&local_b40;
                          local_b10.N = 1;
                          if (pGVar29->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00520d47:
                            if (pRVar40->filter != (RTCFilterFunctionN)0x0) {
                              if (((pRVar40->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                   RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar29->field_8).field_0x2 & 0x40) != 0)) {
                                (*pRVar40->filter)(&local_b10);
                                pGVar29 = local_b60;
                                pSVar30 = local_d40;
                                uVar33 = local_d50;
                                uVar34 = local_d58;
                                uVar35 = local_d60;
                                uVar37 = local_d68;
                                uVar38 = local_d70;
                                pRVar40 = local_b80;
                              }
                              if (*local_b10.valid == 0) goto LAB_00520da8;
                            }
                            if ((local_d00 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            goto LAB_00520e93;
                            break;
                          }
                          (*pGVar29->occlusionFilterN)(&local_b10);
                          pGVar29 = local_b60;
                          pSVar30 = local_d40;
                          uVar33 = local_d50;
                          uVar34 = local_d58;
                          uVar35 = local_d60;
                          uVar37 = local_d68;
                          uVar38 = local_d70;
                          pRVar40 = local_b80;
                          if (*local_b10.valid != 0) goto LAB_00520d47;
LAB_00520da8:
                          ray->tfar = (float)local_ca0._0_4_;
                          uVar45 = local_ce0 ^ 1L << (local_d20 & 0x3f);
                          local_ce0 = uVar45;
                          uVar26 = 0;
                          for (uVar28 = uVar45; (uVar28 & 1) == 0;
                              uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                            uVar26 = uVar26 + 1;
                          }
                          local_d00[0] = uVar45 == 0;
                        } while (uVar45 != 0);
                      }
                    }
                  }
                }
                uVar26 = local_ba0 - 1 & local_ba0;
                pRVar31 = ray;
              } while (uVar26 != 0);
            }
            auVar184 = ZEXT1664(local_c50);
            auVar179 = ZEXT1664(local_c30);
            auVar170 = ZEXT1664(local_c20);
            auVar157 = ZEXT1664(local_c00);
            auVar153 = ZEXT1664(local_bf0);
            auVar136 = ZEXT1664(local_be0);
            auVar124 = ZEXT1664(local_c60);
            auVar114 = ZEXT1664(local_c70);
            auVar130 = ZEXT1664(local_c80);
            local_b98 = local_b98 + 1;
            bVar46 = local_b98 < local_bb8;
            auVar83._0_4_ = local_c10;
            fVar58 = fStack_c0c;
            fVar68 = fStack_c08;
            fVar47 = fStack_c04;
            auVar70._0_4_ = local_c40;
            fVar55 = fStack_c3c;
            fVar56 = fStack_c38;
            fVar57 = fStack_c34;
          } while (local_b98 != local_bb8);
        }
LAB_00520ef6:
        iVar25 = 0;
        if (bVar46) {
          ray->tfar = -INFINITY;
          iVar25 = 3;
        }
      }
    } while (iVar25 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }